

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchIRBuilder.cpp
# Opt level: O2

void __thiscall
SwitchIRBuilder::FixUpMultiBrJumpTable
          (SwitchIRBuilder *this,MultiBranchInstr *multiBranchInstr,uint32 targetOffset)

{
  SwitchAdapter *pSVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  Instr *this_00;
  Instr *this_01;
  Instr *this_02;
  undefined4 *puVar5;
  BranchInstr *pBVar6;
  
  *(ulong *)((long)multiBranchInstr->m_branchTargets + 8) = (ulong)targetOffset;
  uVar4 = IR::Instr::GetByteCodeOffset((Instr *)multiBranchInstr);
  this_00 = IR::Instr::GetPrevRealInstr((Instr *)multiBranchInstr);
  this_01 = IR::Instr::GetPrevRealInstr(this_00);
  this_02 = IR::Instr::GetPrevRealInstr(this_01);
  if (this_00->m_opcode != this->m_subOp) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SwitchIRBuilder.cpp"
                       ,0x2c4,"(subInstr->m_opcode == m_subOp)",
                       "Missing Offset Calculation instruction");
    if (!bVar3) goto LAB_005b5212;
    *puVar5 = 0;
  }
  if ((this_01->m_kind != InstrKindBranch) || (this_02->m_kind != InstrKindBranch)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SwitchIRBuilder.cpp"
                       ,0x2c5,
                       "(upperBoundCheckInstr->IsBranchInstr() && lowerBoundCheckInstr->IsBranchInstr())"
                       ,"Invalid boundary check instructions");
    if (!bVar3) goto LAB_005b5212;
    *puVar5 = 0;
  }
  if ((this_01->m_opcode != this->m_gtOp) || (this_02->m_opcode != this->m_ltOp)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SwitchIRBuilder.cpp"
                       ,0x2c6,
                       "(upperBoundCheckInstr->m_opcode == m_gtOp && lowerBoundCheckInstr->m_opcode == m_ltOp)"
                       ,"Invalid boundary check instructions");
    if (!bVar3) {
LAB_005b5212:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pSVar1 = this->m_adapter;
  pBVar6 = IR::Instr::AsBranchInstr(this_01);
  (*pSVar1->_vptr_SwitchAdapter[2])(pSVar1,pBVar6,(ulong)uVar4,(ulong)targetOffset,1);
  pSVar1 = this->m_adapter;
  pBVar6 = IR::Instr::AsBranchInstr(this_02);
  UNRECOVERED_JUMPTABLE = pSVar1->_vptr_SwitchAdapter[2];
  (*UNRECOVERED_JUMPTABLE)(pSVar1,pBVar6,(ulong)uVar4,(ulong)targetOffset,1,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void
SwitchIRBuilder::FixUpMultiBrJumpTable(IR::MultiBranchInstr * multiBranchInstr, uint32 targetOffset)
{
    multiBranchInstr->FixMultiBrDefaultTarget(targetOffset);

    uint32 offset = multiBranchInstr->GetByteCodeOffset();

    IR::Instr * subInstr = multiBranchInstr->GetPrevRealInstr();
    IR::Instr * upperBoundCheckInstr = subInstr->GetPrevRealInstr();
    IR::Instr * lowerBoundCheckInstr = upperBoundCheckInstr->GetPrevRealInstr();

    AssertMsg(subInstr->m_opcode == m_subOp, "Missing Offset Calculation instruction");
    AssertMsg(upperBoundCheckInstr->IsBranchInstr() && lowerBoundCheckInstr->IsBranchInstr(), "Invalid boundary check instructions");
    AssertMsg(upperBoundCheckInstr->m_opcode == m_gtOp && lowerBoundCheckInstr->m_opcode == m_ltOp, "Invalid boundary check instructions");

    m_adapter->CreateRelocRecord(upperBoundCheckInstr->AsBranchInstr(), offset, targetOffset, true);
    m_adapter->CreateRelocRecord(lowerBoundCheckInstr->AsBranchInstr(), offset, targetOffset, true);
}